

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

shared_ptr<kratos::Var> __thiscall
kratos::PackedSlice::slice_var(PackedSlice *this,shared_ptr<kratos::Var> *var)

{
  PackedSlice *pPVar1;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::Var> sVar2;
  undefined1 local_30 [8];
  shared_ptr<kratos::PortPackedStruct> v;
  
  if (*(int *)(*in_RDX + 0x168) == 4) {
    Var::as<kratos::PortPackedStruct>((Var *)local_30);
    pPVar1 = PortPackedStruct::operator[]
                       ((PortPackedStruct *)local_30,
                        (string *)
                        var[0x29].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &(pPVar1->super_VarSlice).super_Var.super_enable_shared_from_this<kratos::Var>);
  }
  else {
    Var::as<kratos::VarPackedStruct>((Var *)local_30);
    pPVar1 = VarPackedStruct::operator[]
                       ((VarPackedStruct *)local_30,
                        (string *)
                        var[0x29].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &(pPVar1->super_VarSlice).super_Var.super_enable_shared_from_this<kratos::Var>);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&v);
  sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar2.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Var> PackedSlice::slice_var(std::shared_ptr<Var> var) {
    if (var->type() == VarType::PortIO) {
        auto v = var->as<PortPackedStruct>();
        return v->operator[](def_->name).shared_from_this();
    } else {
        auto v = var->as<VarPackedStruct>();
        return v->operator[](def_->name).shared_from_this();
    }
}